

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall
BoardView::ShowSearchResults<std::shared_ptr<Component>>
          (BoardView *this,
          vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *results,
          char *search,int *limit,offset_in_BoardView_to_subr onSelect)

{
  bool bVar1;
  int *in_RCX;
  char *in_RDX;
  long in_RDI;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *in_R8;
  long in_R9;
  char *cname;
  shared_ptr<Component> *r;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *__range1;
  ImGuiSelectableFlags in_stack_00000070;
  undefined1 in_stack_00000077;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_ffffffffffffff58;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_ffffffffffffff60;
  ImVec2 local_70;
  char *local_68;
  reference local_60;
  shared_ptr<Component> *local_58;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_50 [2];
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *local_40;
  long local_38;
  int *local_30;
  char *local_28;
  
  local_40 = in_R8;
  local_38 = in_R9;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_50[0]._M_current =
       (shared_ptr<Component> *)
       std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::begin
                 (in_stack_ffffffffffffff58);
  local_58 = (shared_ptr<Component> *)
             std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
             end(in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
               ::operator*(local_50);
    local_68 = getcname<std::shared_ptr<Component>>((shared_ptr<Component> *)0x13226c);
    ImVec2::ImVec2(&local_70,0.0,0.0);
    bVar1 = ImGui::Selectable((char *)limit,(bool)in_stack_00000077,in_stack_00000070,
                              (ImVec2 *)onSelect);
    if (bVar1) {
      in_stack_ffffffffffffff58 = local_40;
      if (((ulong)local_40 & 1) != 0) {
        in_stack_ffffffffffffff58 =
             *(vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> **)
              ((long)local_40 + *(long *)(in_RDI + local_38) + -1);
      }
      in_stack_ffffffffffffff60 = local_40;
      (*(code *)in_stack_ffffffffffffff58)((long *)(in_RDI + local_38),local_68);
      snprintf(local_28,0x80,"%s",local_68);
      *local_30 = 0;
    }
    *local_30 = *local_30 + -1;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
    ::operator++(local_50);
  }
  return;
}

Assistant:

void BoardView::ShowSearchResults(std::vector<T> results, char *search, int &limit, void (BoardView::*onSelect)(const char *)) {
	for (auto &r : results) {
		const char *cname = getcname(r);
		if (ImGui::Selectable(cname, false)) {
			(this->*onSelect)(cname);
			snprintf(search, 128, "%s", cname);
			limit = 0;
		}
		limit--;
	}
}